

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.h
# Opt level: O2

void table<Result<unsigned_int,double>>
               (ostream *os,
               vector<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
               *rs)

{
  pointer pRVar1;
  ostream *poVar2;
  Result<unsigned_int,_double> *r;
  pointer r_00;
  
  poVar2 = std::operator<<(os,"<div class=\"centercontainer\">");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<table id=\"results\">");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<thead>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<tr>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th></th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th colspan=5>Absolute error</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th colspan=5>Relative error</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th></th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th></th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"</tr>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<tr>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Method</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Min.</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Max.</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Mean</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Median</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Var.</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Min.</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Max.</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Mean</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Median</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Var.</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>stddev</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"<th>Execution time</br>[ns / call]</th>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"</tr>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"</thead>");
  std::endl<char,std::char_traits<char>>(poVar2);
  pRVar1 = (rs->
           super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (r_00 = (rs->
              super__Vector_base<Result<unsigned_int,_double>,_std::allocator<Result<unsigned_int,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start; r_00 != pRVar1; r_00 = r_00 + 1) {
    td<Result<unsigned_int,double>>(os,r_00);
  }
  poVar2 = std::operator<<(os,"</table>");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(os,"</div>");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void table(std::ostream& os, const std::vector<ResultT>& rs)
{
    os << "<div class=\"centercontainer\">" << std::endl;
    os << "<table id=\"results\">" << std::endl;
    os << "<thead>" << std::endl;
    os << "<tr>" << std::endl;
    os << "<th></th>" << std::endl;
    os << "<th colspan=5>Absolute error</th>" << std::endl;
    os << "<th colspan=5>Relative error</th>" << std::endl;
    os << "<th></th>" << std::endl;
    os << "<th></th>" << std::endl;
    os << "</tr>" << std::endl;
    os << "<tr>" << std::endl;
    os << "<th>Method</th>" << std::endl;
    os << "<th>Min.</th>" << std::endl;
    os << "<th>Max.</th>" << std::endl;
    os << "<th>Mean</th>" << std::endl;
    os << "<th>Median</th>" << std::endl;
    os << "<th>Var.</th>" << std::endl;
    os << "<th>Min.</th>" << std::endl;
    os << "<th>Max.</th>" << std::endl;
    os << "<th>Mean</th>" << std::endl;
    os << "<th>Median</th>" << std::endl;
    os << "<th>Var.</th>" << std::endl;
    os << "<th>stddev</th>" << std::endl;
    os << "<th>Execution time</br>[ns / call]</th>" << std::endl;
    os << "</tr>" << std::endl;
    os << "</thead>" << std::endl;
    for (const auto& r : rs)
    {
        td(os, r);
    }
    os << "</table>" << std::endl;
    os << "</div>" << std::endl;
}